

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie2.cpp
# Opt level: O0

int32_t utrie2_internalU8PrevIndex_63(UTrie2 *trie,UChar32 c,uint8_t *start,uint8_t *src)

{
  int32_t iVar1;
  int32_t local_2c;
  int32_t length;
  int32_t i;
  uint8_t *src_local;
  uint8_t *start_local;
  UTrie2 *pUStack_10;
  UChar32 c_local;
  UTrie2 *trie_local;
  
  if ((long)src - (long)start < 8) {
    local_2c = (int)src - (int)start;
    src_local = start;
  }
  else {
    local_2c = 7;
    src_local = src + -7;
  }
  iVar1 = local_2c;
  _length = src;
  start_local._4_4_ = c;
  pUStack_10 = trie;
  start_local._4_4_ = utf8_prevCharSafeBody_63(src_local,0,&local_2c,c,-1);
  local_2c = iVar1 - local_2c;
  iVar1 = u8Index(pUStack_10,start_local._4_4_,local_2c);
  return iVar1;
}

Assistant:

U_CAPI int32_t U_EXPORT2
utrie2_internalU8PrevIndex(const UTrie2 *trie, UChar32 c,
                           const uint8_t *start, const uint8_t *src) {
    int32_t i, length;
    /* support 64-bit pointers by avoiding cast of arbitrary difference */
    if((src-start)<=7) {
        i=length=(int32_t)(src-start);
    } else {
        i=length=7;
        start=src-7;
    }
    c=utf8_prevCharSafeBody(start, 0, &i, c, -1);
    i=length-i;  /* number of bytes read backward from src */
    return u8Index(trie, c, i);
}